

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall
Json::Value::CZString::CZString(CZString *this,char *cstr,DuplicationPolicy allocate)

{
  int in_EDX;
  char *in_RSI;
  undefined8 *in_RDI;
  char *unaff_retaddr;
  char *local_28;
  
  local_28 = in_RSI;
  if (in_EDX == 1) {
    local_28 = duplicateStringValue(unaff_retaddr,(uint)((ulong)in_RDI >> 0x20));
  }
  *in_RDI = local_28;
  *(int *)(in_RDI + 1) = in_EDX;
  return;
}

Assistant:

Value::CZString::CZString(const char* cstr, DuplicationPolicy allocate)
    : cstr_(allocate == duplicate ? duplicateStringValue(cstr) : cstr),
      index_(allocate) {}